

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# censor1.c
# Opt level: O0

int ssh1_censor_packet(PacketLogSettings *pls,int type,_Bool sender_is_client,ptrlen pkt,
                      logblank_t *blanks)

{
  ptrlen pVar1;
  undefined1 local_78 [8];
  BinarySource src [1];
  ptrlen str;
  int nblanks;
  logblank_t *blanks_local;
  _Bool sender_is_client_local;
  int type_local;
  PacketLogSettings *pls_local;
  ptrlen pkt_local;
  
  str.len._4_4_ = 0;
  BinarySource_INIT__((BinarySource *)local_78,pkt);
  if (((pls->omit_data & 1U) != 0) &&
     ((((type == 0x11 || (type == 0x12)) || (type == 0x10)) || (type == 0x17)))) {
    if (type == 0x17) {
      BinarySource_get_uint32((BinarySource *)src[0]._24_8_);
    }
    pVar1 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
    str.len._4_1_ = *(int *)(src[0]._24_8_ + 0x18) == 0;
    if (str.len._4_1_) {
      blanks->offset = (int)src[0].data - (int)pVar1.len;
      blanks->type = 2;
      blanks->len = (int)pVar1.len;
    }
    str.len._5_3_ = 0;
  }
  if ((sender_is_client) && ((pls->omit_passwords & 1U) != 0)) {
    if ((type == 9) || ((type == 0x29 || (type == 0x48)))) {
      if (3 < str.len._4_4_) {
        __assert_fail("nblanks < MAX_BLANKS",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/censor1.c"
                      ,0x2e,
                      "int ssh1_censor_packet(const PacketLogSettings *, int, _Bool, ptrlen, logblank_t *)"
                     );
      }
      blanks[(int)str.len._4_4_].offset = 0;
      blanks[(int)str.len._4_4_].len = (int)pkt.len;
      blanks[(int)str.len._4_4_].type = 1;
      str.len._4_4_ = str.len._4_4_ + 1;
    }
    else if (type == 0x22) {
      BinarySource_get_string((BinarySource *)src[0]._24_8_);
      pVar1 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
      if (*(int *)(src[0]._24_8_ + 0x18) == 0) {
        if (3 < str.len._4_4_) {
          __assert_fail("nblanks < MAX_BLANKS",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/censor1.c"
                        ,0x42,
                        "int ssh1_censor_packet(const PacketLogSettings *, int, _Bool, ptrlen, logblank_t *)"
                       );
        }
        blanks[(int)str.len._4_4_].offset = (int)src[0].data - (int)pVar1.len;
        blanks[(int)str.len._4_4_].type = 1;
        blanks[(int)str.len._4_4_].len = (int)pVar1.len;
        str.len._4_4_ = str.len._4_4_ + 1;
      }
    }
  }
  return str.len._4_4_;
}

Assistant:

int ssh1_censor_packet(
    const PacketLogSettings *pls, int type, bool sender_is_client,
    ptrlen pkt, logblank_t *blanks)
{
    int nblanks = 0;
    ptrlen str;
    BinarySource src[1];

    BinarySource_BARE_INIT_PL(src, pkt);

    if (pls->omit_data &&
        (type == SSH1_SMSG_STDOUT_DATA ||
         type == SSH1_SMSG_STDERR_DATA ||
         type == SSH1_CMSG_STDIN_DATA ||
         type == SSH1_MSG_CHANNEL_DATA)) {
        /* "Session data" packets - omit the data string. */
        if (type == SSH1_MSG_CHANNEL_DATA)
            get_uint32(src);           /* skip channel id */
        str = get_string(src);
        if (!get_err(src)) {
            assert(nblanks < MAX_BLANKS);
            blanks[nblanks].offset = src->pos - str.len;
            blanks[nblanks].type = PKTLOG_OMIT;
            blanks[nblanks].len = str.len;
            nblanks++;
        }
    }

    if (sender_is_client && pls->omit_passwords) {
        if (type == SSH1_CMSG_AUTH_PASSWORD ||
            type == SSH1_CMSG_AUTH_TIS_RESPONSE ||
            type == SSH1_CMSG_AUTH_CCARD_RESPONSE) {
            /* If this is a password or similar packet, blank the
             * password(s). */
            assert(nblanks < MAX_BLANKS);
            blanks[nblanks].offset = 0;
            blanks[nblanks].len = pkt.len;
            blanks[nblanks].type = PKTLOG_BLANK;
            nblanks++;
        } else if (type == SSH1_CMSG_X11_REQUEST_FORWARDING) {
            /*
             * If this is an X forwarding request packet, blank the
             * fake auth data.
             *
             * Note that while we blank the X authentication data
             * here, we don't take any special action to blank the
             * start of an X11 channel, so using MIT-MAGIC-COOKIE-1
             * and actually opening an X connection without having
             * session blanking enabled is likely to leak your cookie
             * into the log.
             */
            get_string(src);              /* skip protocol name */
            str = get_string(src);
            if (!get_err(src)) {
                assert(nblanks < MAX_BLANKS);
                blanks[nblanks].offset = src->pos - str.len;
                blanks[nblanks].type = PKTLOG_BLANK;
                blanks[nblanks].len = str.len;
                nblanks++;
            }
        }
    }

    return nblanks;
}